

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test::testBody
          (TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  MockSupport *pMVar3;
  TestTerminator *pTVar4;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_a8;
  MockExpectedCallsListForTest expectations;
  SimpleString local_88;
  MockExpectedCallsDidntHappenFailure expectedFailure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MockExpectedCallsList::MockExpectedCallsList(&expectations.super_MockExpectedCallsList);
  expectations.super_MockExpectedCallsList._vptr_MockExpectedCallsList =
       (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"foobar");
  MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&expectedFailure);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  pUVar2 = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            (&expectedFailure,pUVar2,&expectations.super_MockExpectedCallsList);
  SimpleString::SimpleString(&local_a8,"");
  pMVar3 = mock(&local_a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"foobar");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_88);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::SimpleString(&local_a8,"");
  pMVar3 = mock(&local_a8,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_a8);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_a8,"");
  pMVar3 = mock(&local_a8,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar3->_vptr_MockSupport[0x26])(pMVar3);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(byte)((byte)iVar1 ^ 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x61,pTVar4);
  SimpleString::~SimpleString(&local_a8);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x62);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockCallTest, checkExpectationsClearsTheExpectations)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foobar");
    mock().checkExpectations();

    CHECK(! mock().expectedCallsLeft());
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}